

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarExecFuse.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  stringstream *this;
  xar *this_00;
  size_type sVar1;
  undefined8 uVar2;
  __suseconds_t _Var3;
  __dev_t _Var4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  __uid_t _Var8;
  __uid_t _Var9;
  __mode_t __mask;
  int iVar10;
  int iVar11;
  __pid_t __pid;
  __pid_t _Var12;
  uint __fd;
  int iVar13;
  mapped_type *pmVar14;
  unsigned_long_long uVar15;
  iterator iVar16;
  char *pcVar17;
  istream *piVar18;
  ostream *poVar19;
  int *piVar20;
  long lVar21;
  long lVar22;
  char *pcVar23;
  char *pcVar24;
  invalid_argument *this_01;
  long lVar25;
  char **ppcVar26;
  char **ppcVar27;
  ulong uVar28;
  long lVar29;
  optional<unsigned_long> oVar30;
  char *pcStack_4c0;
  char *pcStack_4b8;
  undefined1 local_4b0 [8];
  timeval tv;
  stat st;
  string local_3f0;
  undefined1 local_3d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> lockfile;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  header;
  string execpath;
  string uuid;
  string user_basedir;
  string exec_path;
  undefined1 local_2f0 [8];
  string mountroot;
  stat st_1;
  undefined1 local_c8 [8];
  int status;
  undefined1 local_a8 [8];
  string mount_directory;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mount_path;
  int local_38;
  
  ppcVar26 = &pcStack_4b8;
  uVar28 = (ulong)(uint)argc;
  pcStack_4c0 = (char *)0x1037f7;
  gettimeofday((timeval *)local_4b0,(__timezone_ptr_t)0x0);
  pcStack_4c0 = (char *)0x10381d;
  std::__cxx11::to_string
            ((string *)(mountroot.field_2._M_local_buf + 8),
             (double)(long)local_4b0 + (double)tv.tv_sec / 1000000.0);
  pcStack_4c0 = (char *)0x103833;
  setenv("XAREXEC_LAUNCH_TIMESTAMP",(char *)mountroot.field_2._8_8_,1);
  pcStack_4c0 = (char *)0x10383b;
  std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
  pcStack_4c0 = (char *)0x103840;
  _Var8 = getuid();
  pcStack_4c0 = (char *)0x103847;
  _Var9 = geteuid();
  if (_Var8 == _Var9) {
    pcStack_4c0 = (char *)0x103857;
    __mask = umask(0x12);
    if (1 < argc) {
      bVar7 = false;
      pcVar23 = (char *)0x0;
      do {
        iVar13 = (int)uVar28;
        lVar29 = (long)iVar13 + 2;
        lVar21 = 0;
        pcVar17 = pcVar23;
        ppcVar26 = argv + 2;
        do {
          ppcVar27 = ppcVar26;
          pcVar23 = pcVar17;
          mount_path.field_2._8_8_ = lVar21;
          this_00 = (xar *)argv[mount_path.field_2._8_8_ + 1];
          if (this_00 == (xar *)0x0) goto LAB_0010385d;
          if (*this_00 != (xar)0x2d) {
            pcStack_4c0 = (char *)0x103907;
            tools::xar::read_xar_header_abi_cxx11_
                      ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&lockfile.field_2 + 8),this_00,pcVar23);
            pcStack_4c0 = (char *)0x103921;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(mountroot.field_2._M_local_buf + 8),"OFFSET",
                       (allocator<char> *)local_a8);
            pcStack_4c0 = (char *)0x103934;
            pmVar14 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(lockfile.field_2._M_local_buf + 8),
                                   (key_type *)((long)&mountroot.field_2 + 8));
            pcStack_4c0 = (char *)0x103946;
            uVar15 = std::__cxx11::stoull(pmVar14,(size_t *)&tv.tv_usec,10);
            pcStack_4c0 = (char *)0x103955;
            std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
            _Var3 = tv.tv_usec;
            pcStack_4c0 = (char *)0x103976;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(mountroot.field_2._M_local_buf + 8),"OFFSET",
                       (allocator<char> *)local_a8);
            pcStack_4c0 = (char *)0x10398d;
            mount_directory.field_2._8_8_ = uVar15;
            pmVar14 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(lockfile.field_2._M_local_buf + 8),
                                   (key_type *)((long)&mountroot.field_2 + 8));
            sVar1 = pmVar14->_M_string_length;
            pcStack_4c0 = (char *)0x10399d;
            std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
            if (_Var3 != sVar1) {
              pcStack_4c0 = (char *)0x104603;
              this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
              pcStack_4c0 = (char *)0x104615;
              std::invalid_argument::invalid_argument(this_01,"Offset not entirely an integer");
              pcStack_4c0 = (char *)0x10462b;
              __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            pcStack_4c0 = (char *)0x1039c0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(mountroot.field_2._M_local_buf + 8),"UUID",
                       (allocator<char> *)&tv.tv_usec);
            pcStack_4c0 = (char *)0x1039d3;
            pmVar14 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)(lockfile.field_2._M_local_buf + 8),
                                   (key_type *)((long)&mountroot.field_2 + 8));
            pcStack_4c0 = (char *)0x1039e2;
            std::__cxx11::string::string
                      ((string *)(execpath.field_2._M_local_buf + 8),(string *)pmVar14);
            pcStack_4c0 = (char *)0x1039ee;
            std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
            header._M_h._M_single_bucket = (__node_base_ptr)&execpath._M_string_length;
            execpath._M_dataplus._M_p = (pointer)0x0;
            execpath._M_string_length._0_1_ = 0;
            pcStack_4c0 = (char *)0x103a1b;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(mountroot.field_2._M_local_buf + 8),"XAREXEC_TARGET",
                       (allocator<char> *)&tv.tv_usec);
            pcStack_4c0 = (char *)0x103a2e;
            iVar16 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)((long)&lockfile.field_2 + 8),
                            (key_type *)((long)&mountroot.field_2 + 8));
            pcStack_4c0 = (char *)0x103a3d;
            std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
            if (iVar16.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              pcStack_4c0 = (char *)0x103a55;
              std::__cxx11::string::_M_assign((string *)&header._M_h._M_single_bucket);
            }
            if (execpath._M_dataplus._M_p == (pointer)0x0 && pcVar23 == (char *)0x0) {
              pcStack_4c0 = (char *)0x104641;
              memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
              pcStack_4c0 = (char *)0x104649;
              std::__cxx11::stringstream::stringstream
                        ((stringstream *)(mountroot.field_2._M_local_buf + 8));
              pcStack_4c0 = (char *)0x10465c;
              poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
              pcStack_4c0 = (char *)0x10466b;
              poVar19 = std::operator<<(poVar19,
                                        "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                       );
              pcStack_4c0 = (char *)0x10467a;
              poVar19 = std::operator<<(poVar19,":");
              pcStack_4c0 = (char *)0x104687;
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x126);
              pcStack_4c0 = (char *)0x104696;
              poVar19 = std::operator<<(poVar19,": ");
              pcStack_4c0 = (char *)0x1046a5;
              poVar19 = std::operator<<(poVar19,"No XAREXEC_TARGET in XAR header of ");
              pcStack_4c0 = (char *)0x1046b0;
              std::operator<<(poVar19,(char *)this_00);
              ppcVar26 = &pcStack_4b8;
              goto LAB_001055d2;
            }
            pcStack_4c0 = (char *)0x103a88;
            bVar5 = std::
                    all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )execpath.field_2._8_8_,
                               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(uuid._M_dataplus._M_p + execpath.field_2._8_8_),isxdigit);
            if (!bVar5) {
              pcStack_4c0 = (char *)0x1046cb;
              memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
              pcStack_4c0 = (char *)0x1046d3;
              std::__cxx11::stringstream::stringstream
                        ((stringstream *)(mountroot.field_2._M_local_buf + 8));
              pcStack_4c0 = (char *)0x1046e6;
              poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
              pcStack_4c0 = (char *)0x1046f5;
              poVar19 = std::operator<<(poVar19,
                                        "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                       );
              pcStack_4c0 = (char *)0x104704;
              poVar19 = std::operator<<(poVar19,":");
              pcStack_4c0 = (char *)0x104711;
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x129);
              pcStack_4c0 = (char *)0x104720;
              poVar19 = std::operator<<(poVar19,": ");
              pcStack_4c0 = (char *)0x10472f;
              std::operator<<(poVar19,"uuid must only contain hex digits");
              ppcVar26 = &pcStack_4b8;
              goto LAB_001055d2;
            }
            if (uuid._M_dataplus._M_p == (pointer)0x0) {
              pcStack_4c0 = (char *)0x10474a;
              memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
              pcStack_4c0 = (char *)0x104752;
              std::__cxx11::stringstream::stringstream
                        ((stringstream *)(mountroot.field_2._M_local_buf + 8));
              pcStack_4c0 = (char *)0x104765;
              poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
              pcStack_4c0 = (char *)0x104774;
              poVar19 = std::operator<<(poVar19,
                                        "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                       );
              pcStack_4c0 = (char *)0x104783;
              poVar19 = std::operator<<(poVar19,":");
              pcStack_4c0 = (char *)0x104790;
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,300);
              pcStack_4c0 = (char *)0x10479f;
              poVar19 = std::operator<<(poVar19,": ");
              pcStack_4c0 = (char *)0x1047ae;
              std::operator<<(poVar19,"uuid must be non-empty");
              ppcVar26 = &pcStack_4b8;
              goto LAB_001055d2;
            }
            local_2f0 = (undefined1  [8])&mountroot._M_string_length;
            mountroot._M_dataplus._M_p = (pointer)0x0;
            mountroot._M_string_length._0_1_ = 0;
            pcStack_4c0 = (char *)0x103acb;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)(mountroot.field_2._M_local_buf + 8),"MOUNT_ROOT",
                       (allocator<char> *)&tv.tv_usec);
            pcStack_4c0 = (char *)0x103ade;
            iVar16 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)((long)&lockfile.field_2 + 8),
                            (key_type *)((long)&mountroot.field_2 + 8));
            pcStack_4c0 = (char *)0x103aed;
            std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
            if (iVar16.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              pcStack_4c0 = (char *)0x103b1a;
              tools::xar::default_mount_roots_abi_cxx11_();
              _Var4 = st.st_dev;
              goto LAB_00103b2f;
            }
            pcStack_4c0 = (char *)0x103b05;
            std::__cxx11::string::_M_assign((string *)local_2f0);
            goto LAB_00103b8a;
          }
          if (this_00[1] != (xar)0x6d) break;
          lVar29 = lVar29 + -1;
          lVar21 = mount_path.field_2._8_8_ + 1;
          pcVar17 = (char *)0x1;
          ppcVar26 = ppcVar27 + 1;
        } while (this_00[2] == (xar)0x0);
        if (this_00[1] != (xar)0x6e) break;
        argv = ppcVar27 + -1;
        uVar28 = (ulong)(iVar13 - 1) - mount_path.field_2._8_8_;
        bVar7 = true;
      } while (this_00[2] == (xar)0x0);
      if ((this_00[1] == (xar)0x68) && (this_00[2] == (xar)0x0)) {
        pcStack_4c0 = (char *)0x1038e1;
        anon_unknown.dwarf_5eda::usage();
        return 0;
      }
    }
LAB_0010385d:
    pcStack_4c0 = (char *)0x103862;
    anon_unknown.dwarf_5eda::usage();
    return 1;
  }
  pcStack_4c0 = (char *)0x1044ea;
  memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
  pcStack_4c0 = (char *)0x1044f2;
  std::__cxx11::stringstream::stringstream((stringstream *)(mountroot.field_2._M_local_buf + 8));
  pcStack_4c0 = (char *)0x104505;
  poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
  pcStack_4c0 = (char *)0x104514;
  poVar19 = std::operator<<(poVar19,
                            "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                           );
  pcStack_4c0 = (char *)0x104523;
  poVar19 = std::operator<<(poVar19,":");
  pcStack_4c0 = (char *)0x104530;
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,0xe7);
  pcStack_4c0 = (char *)0x10453f;
  poVar19 = std::operator<<(poVar19,": ");
  pcStack_4c0 = (char *)0x10454e;
  std::operator<<(poVar19,"getuid() == geteuid()");
  goto LAB_001055d2;
LAB_00103b2f:
  if (tv.tv_usec == _Var4) goto LAB_00103b6c;
  pcStack_4c0 = (char *)0x103b3f;
  iVar10 = stat(*(char **)tv.tv_usec,(stat *)((long)&mountroot.field_2 + 8));
  if ((iVar10 == 0) && (((uint)st_1.st_nlink & 0xfff) == 0x3ff)) {
    pcStack_4c0 = (char *)0x103b6c;
    std::__cxx11::string::_M_assign((string *)local_2f0);
    goto LAB_00103b6c;
  }
  tv.tv_usec = tv.tv_usec + 0x20;
  goto LAB_00103b2f;
LAB_00103b6c:
  pcStack_4c0 = (char *)0x103b78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tv.tv_usec);
  if (mountroot._M_dataplus._M_p == (pointer)0x0) {
    pcStack_4c0 = (char *)0x104b9f;
    memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
    pcStack_4c0 = (char *)0x104ba7;
    std::__cxx11::stringstream::stringstream((stringstream *)(mountroot.field_2._M_local_buf + 8));
    pcStack_4c0 = (char *)0x104bba;
    poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
    pcStack_4c0 = (char *)0x104bc9;
    poVar19 = std::operator<<(poVar19,
                              "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                             );
    pcStack_4c0 = (char *)0x104bd8;
    poVar19 = std::operator<<(poVar19,":");
    pcStack_4c0 = (char *)0x104be5;
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x13f);
    pcStack_4c0 = (char *)0x104bf4;
    poVar19 = std::operator<<(poVar19,": ");
    pcStack_4c0 = (char *)0x104bfc;
    tools::xar::no_mount_roots_help_message(poVar19);
    ppcVar26 = &pcStack_4b8;
    goto LAB_001055d2;
  }
LAB_00103b8a:
  pcStack_4c0 = (char *)0x103b9d;
  iVar10 = stat((char *)local_2f0,(stat *)&tv.tv_usec);
  if (iVar10 != 0) {
    pcStack_4c0 = (char *)0x1047c9;
    memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
    pcStack_4c0 = (char *)0x1047d1;
    std::__cxx11::stringstream::stringstream((stringstream *)(mountroot.field_2._M_local_buf + 8));
    pcStack_4c0 = (char *)0x1047e4;
    poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
    pcStack_4c0 = (char *)0x1047f3;
    poVar19 = std::operator<<(poVar19,
                              "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                             );
    pcStack_4c0 = (char *)0x104802;
    poVar19 = std::operator<<(poVar19,":");
    pcStack_4c0 = (char *)0x10480f;
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x145);
    pcStack_4c0 = (char *)0x10481e;
    poVar19 = std::operator<<(poVar19,": ");
    pcStack_4c0 = (char *)0x10482d;
    poVar19 = std::operator<<(poVar19,"Failed to stat mount root \'");
    pcStack_4c0 = (char *)0x10483c;
    poVar19 = std::operator<<(poVar19,(string *)local_2f0);
    pcStack_4c0 = (char *)0x10484b;
    poVar19 = std::operator<<(poVar19,"\': ");
    pcStack_4c0 = (char *)0x104853;
    piVar20 = __errno_location();
    pcStack_4c0 = (char *)0x10485a;
    pcVar23 = strerror(*piVar20);
    pcStack_4c0 = (char *)0x104865;
    std::operator<<(poVar19,pcVar23);
    ppcVar26 = &pcStack_4b8;
    goto LAB_001055d2;
  }
  if (((uint)st.st_nlink & 0xfff) != 0x3ff) {
    pcStack_4c0 = (char *)0x104880;
    memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
    pcStack_4c0 = (char *)0x104888;
    std::__cxx11::stringstream::stringstream((stringstream *)(mountroot.field_2._M_local_buf + 8));
    pcStack_4c0 = (char *)0x10489b;
    poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
    pcStack_4c0 = (char *)0x1048aa;
    poVar19 = std::operator<<(poVar19,
                              "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                             );
    pcStack_4c0 = (char *)0x1048b9;
    poVar19 = std::operator<<(poVar19,":");
    pcStack_4c0 = (char *)0x1048c6;
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x149);
    pcStack_4c0 = (char *)0x1048d5;
    poVar19 = std::operator<<(poVar19,": ");
    pcStack_4c0 = (char *)0x1048e4;
    poVar19 = std::operator<<(poVar19,"Mount root \'");
    pcStack_4c0 = (char *)0x1048f3;
    poVar19 = std::operator<<(poVar19,(string *)local_2f0);
    pcStack_4c0 = (char *)0x104902;
    std::operator<<(poVar19,"\' permissions should be 01777");
    ppcVar26 = &pcStack_4b8;
    goto LAB_001055d2;
  }
  pcStack_4c0 = (char *)0x103bd5;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mountroot.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                 "/uid-");
  pcStack_4c0 = (char *)0x103bda;
  _Var8 = geteuid();
  pcStack_4c0 = (char *)0x103be8;
  std::__cxx11::to_string((string *)local_a8,_Var8);
  pcStack_4c0 = (char *)0x103c02;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&uuid.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mountroot.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  pcStack_4c0 = (char *)0x103c0e;
  std::__cxx11::string::~string((string *)local_a8);
  pcStack_4c0 = (char *)0x103c1a;
  std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
  pcStack_4c0 = (char *)0x103c2e;
  mkdir((char *)uuid.field_2._8_8_,0x1ed);
  pcStack_4c0 = (char *)0x103c3e;
  anon_unknown.dwarf_5eda::check_file_sanity((string *)((long)&uuid.field_2 + 8),Directory,0x1ed);
  pcStack_4c0 = (char *)0x103c4a;
  pcVar17 = getenv("XAR_MOUNT_SEED");
  pcStack_4c0 = (char *)0x103c60;
  std::__cxx11::string::string((string *)local_a8,(string *)(execpath.field_2._M_local_buf + 8));
  if ((pcVar17 == (char *)0x0) || (*pcVar17 == '\0')) {
LAB_00103c7f:
    pcStack_4c0 = (char *)0x103c92;
    iVar10 = stat("/proc/self/ns/pid",(stat *)&tv.tv_usec);
    if (iVar10 == 0) {
      pcStack_4c0 = (char *)0x103caa;
      std::__cxx11::to_string((string *)local_68,st.st_dev);
      pcStack_4c0 = (char *)0x103cc1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&mountroot.field_2 + 8),"-seed-nspid",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      pcStack_4c0 = (char *)0x103cd4;
      std::__cxx11::string::append((string *)local_a8);
      pcStack_4c0 = (char *)0x103ce0;
      std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
      pcStack_4c0 = (char *)0x103ce9;
      std::__cxx11::string::~string((string *)local_68);
      pcStack_4c0 = (char *)0x103cf5;
      oVar30 = tools::xar::read_sysfs_cgroup_inode("/proc/self/cgroup");
      if (((undefined1  [16])
           oVar30.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
          (undefined1  [16])0x0) {
        pcStack_4c0 = (char *)0x103d06;
        std::__cxx11::to_string
                  ((string *)local_68,
                   oVar30.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_payload);
        pcStack_4c0 = (char *)0x103d1d;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&mountroot.field_2 + 8),"_cgpid",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
        pcStack_4c0 = (char *)0x103d30;
        std::__cxx11::string::append((string *)local_a8);
        pcStack_4c0 = (char *)0x103d3c;
        std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
        pcStack_4c0 = (char *)0x103d45;
        std::__cxx11::string::~string((string *)local_68);
      }
    }
  }
  else {
    pcStack_4c0 = (char *)0x103c76;
    pcVar17 = strchr(pcVar17,0x2f);
    if (pcVar17 != (char *)0x0) goto LAB_00103c7f;
    pcStack_4c0 = (char *)0x103d5a;
    std::__cxx11::string::append(local_a8);
    pcStack_4c0 = (char *)0x103d69;
    std::__cxx11::string::append(local_a8);
  }
  pcStack_4c0 = (char *)0x103d7c;
  iVar10 = stat("/proc/self/ns/mnt",(stat *)&tv.tv_usec);
  if (iVar10 == 0) {
    pcStack_4c0 = (char *)0x103d90;
    std::__cxx11::to_string((string *)local_68,st.st_dev);
    pcStack_4c0 = (char *)0x103da7;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&mountroot.field_2 + 8),"-ns-",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    pcStack_4c0 = (char *)0x103dba;
    std::__cxx11::string::append((string *)local_a8);
    pcStack_4c0 = (char *)0x103dc6;
    std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
    pcStack_4c0 = (char *)0x103dcf;
    std::__cxx11::string::~string((string *)local_68);
  }
  pcStack_4c0 = (char *)0x103ddb;
  pcVar17 = getenv("XAR_MOUNT_TIMEOUT");
  if (pcVar17 == (char *)0x0) {
    pcStack_4c0 = (char *)0x103e08;
    std::ifstream::ifstream
              ((void *)((long)&mountroot.field_2 + 8),"/var/lib/xarexec_timeout_override",_S_in);
    pcStack_4c0 = (char *)0x103e14;
    cVar6 = std::__basic_file<char>::is_open();
    if (cVar6 == '\0') {
LAB_00103e3a:
      uVar28 = 0x366;
    }
    else {
      pcStack_4c0 = (char *)0x103e28;
      piVar18 = std::istream::_M_extract<unsigned_int>((uint *)(mountroot.field_2._M_local_buf + 8))
      ;
      if (((byte)piVar18[*(long *)(*(long *)piVar18 + -0x18) + 0x20] & 5) != 0) goto LAB_00103e3a;
      uVar28 = (ulong)(uint)local_68._0_4_;
    }
    pcStack_4c0 = (char *)0x103e4c;
    std::ifstream::~ifstream((void *)((long)&mountroot.field_2 + 8));
  }
  else {
    pcStack_4c0 = (char *)0x103ded;
    uVar28 = strtoul(pcVar17,(char **)0x0,10);
  }
  pcStack_4c0 = (char *)0x103e66;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mountroot.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&uuid.field_2 + 8),"/");
  pcStack_4c0 = (char *)0x103e7d;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mountroot.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  pcStack_4c0 = (char *)0x103e89;
  std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
  if (bVar7) {
    pcStack_4c0 = (char *)0x103e9f;
    poVar19 = std::operator<<((ostream *)&std::cout,(string *)local_68);
    pcStack_4c0 = (char *)0x103ea7;
    std::endl<char,std::char_traits<char>>(poVar19);
LAB_001043e6:
    pcStack_4c0 = (char *)0x1043ef;
    std::__cxx11::string::~string((string *)local_68);
    pcStack_4c0 = (char *)0x1043fb;
    std::__cxx11::string::~string((string *)local_a8);
    pcStack_4c0 = (char *)0x104407;
    std::__cxx11::string::~string((string *)(uuid.field_2._M_local_buf + 8));
    pcStack_4c0 = (char *)0x104413;
    std::__cxx11::string::~string((string *)local_2f0);
    pcStack_4c0 = (char *)0x10441f;
    std::__cxx11::string::~string((string *)&header._M_h._M_single_bucket);
    pcStack_4c0 = (char *)0x10442b;
    std::__cxx11::string::~string((string *)(execpath.field_2._M_local_buf + 8));
    pcStack_4c0 = (char *)0x104437;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)((long)&lockfile.field_2 + 8));
    return 0;
  }
  pcStack_4c0 = (char *)0x103ec6;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mountroot.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&uuid.field_2 + 8),"/lockfile.");
  pcStack_4c0 = (char *)0x103ee0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mountroot.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  pcStack_4c0 = (char *)0x103ef0;
  std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
  pcStack_4c0 = (char *)0x103f08;
  iVar10 = open((char *)local_3d0,0x80042,0x180);
  if (iVar10 < 0) {
    pcStack_4c0 = (char *)0x10491d;
    memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
    pcStack_4c0 = (char *)0x104925;
    std::__cxx11::stringstream::stringstream((stringstream *)(mountroot.field_2._M_local_buf + 8));
    pcStack_4c0 = (char *)0x104938;
    poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
    pcStack_4c0 = (char *)0x104947;
    poVar19 = std::operator<<(poVar19,
                              "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                             );
    pcStack_4c0 = (char *)0x104956;
    poVar19 = std::operator<<(poVar19,":");
    pcStack_4c0 = (char *)0x104963;
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x80);
    pcStack_4c0 = (char *)0x104972;
    poVar19 = std::operator<<(poVar19,": ");
    pcStack_4c0 = (char *)0x104981;
    poVar19 = std::operator<<(poVar19,"can\'t open lockfile: ");
    pcStack_4c0 = (char *)0x104989;
    piVar20 = __errno_location();
    pcStack_4c0 = (char *)0x104990;
    pcVar23 = strerror(*piVar20);
    pcStack_4c0 = (char *)0x10499b;
    std::operator<<(poVar19,pcVar23);
    ppcVar26 = &pcStack_4b8;
  }
  else {
    pcStack_4c0 = (char *)0x103f27;
    anon_unknown.dwarf_5eda::check_file_sanity((string *)local_3d0,File,0x180);
    pcStack_4c0 = (char *)0x103f32;
    iVar11 = flock(iVar10);
    if (iVar11 == 0) {
      pcStack_4c0 = (char *)0x103f48;
      iVar11 = mkdir((char *)CONCAT44(local_68._4_4_,local_68._0_4_),0x1ed);
      if (iVar11 != 0) {
        pcStack_4c0 = (char *)0x103f51;
        piVar20 = __errno_location();
        if (*piVar20 != 0x11) {
          pcStack_4c0 = (char *)0x104c1a;
          memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
          pcStack_4c0 = (char *)0x104c22;
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)(mountroot.field_2._M_local_buf + 8));
          pcStack_4c0 = (char *)0x104c35;
          poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
          pcStack_4c0 = (char *)0x104c44;
          poVar19 = std::operator<<(poVar19,
                                    "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                   );
          pcStack_4c0 = (char *)0x104c53;
          poVar19 = std::operator<<(poVar19,":");
          pcStack_4c0 = (char *)0x104c60;
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,399);
          pcStack_4c0 = (char *)0x104c6f;
          poVar19 = std::operator<<(poVar19,": ");
          pcStack_4c0 = (char *)0x104c7e;
          poVar19 = std::operator<<(poVar19,"mkdir failed:");
          pcStack_4c0 = (char *)0x104c8a;
          pcVar23 = strerror(*piVar20);
          pcStack_4c0 = (char *)0x104c95;
          std::operator<<(poVar19,pcVar23);
          ppcVar26 = &pcStack_4b8;
          goto LAB_001055d2;
        }
      }
      pcStack_4c0 = (char *)0x103f71;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&mountroot.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "/");
      pcStack_4c0 = (char *)0x103f8b;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&user_basedir.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&mountroot.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &header._M_h._M_single_bucket);
      pcStack_4c0 = (char *)0x103f9b;
      std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
      pcStack_4c0 = (char *)0x103fab;
      local_38 = open((char *)user_basedir.field_2._8_8_,0);
      pcStack_4c0 = (char *)0x103fba;
      bVar7 = anon_unknown.dwarf_5eda::is_squashfuse_mounted((string *)local_68,true);
      if (!bVar7) {
        if (local_38 != -1) {
          pcStack_4c0 = (char *)0x103fd3;
          close(local_38);
        }
        pcStack_4c0 = (char *)0x103fe4;
        anon_unknown.dwarf_5eda::check_file_sanity((string *)local_68,Directory,0x1ed);
        pcStack_4c0 = (char *)0x103fe9;
        __pid = fork();
        if (__pid < 0) {
          pcStack_4c0 = (char *)0x104cb0;
          memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
          pcStack_4c0 = (char *)0x104cb8;
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)(mountroot.field_2._M_local_buf + 8));
          pcStack_4c0 = (char *)0x104ccb;
          poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
          pcStack_4c0 = (char *)0x104cda;
          poVar19 = std::operator<<(poVar19,
                                    "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                   );
          pcStack_4c0 = (char *)0x104ce9;
          poVar19 = std::operator<<(poVar19,":");
          pcStack_4c0 = (char *)0x104cf6;
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x1ba);
          pcStack_4c0 = (char *)0x104d05;
          poVar19 = std::operator<<(poVar19,": ");
          pcStack_4c0 = (char *)0x104d14;
          poVar19 = std::operator<<(poVar19,"pid >= 0");
          pcStack_4c0 = (char *)0x104d23;
          poVar19 = std::operator<<(poVar19,": ");
          pcStack_4c0 = (char *)0x104d2b;
          piVar20 = __errno_location();
          pcStack_4c0 = (char *)0x104d32;
          pcVar23 = strerror(*piVar20);
          pcStack_4c0 = (char *)0x104d3d;
          std::operator<<(poVar19,pcVar23);
          ppcVar26 = &pcStack_4b8;
          goto LAB_001055d2;
        }
        local_38 = -1;
        if (__pid == 0) {
          pcStack_4c0 = (char *)0x1040cc;
          tools::xar::close_non_std_fds();
          pcStack_4c0 = (char *)0x1040dc;
          iVar11 = open("/dev/null",0);
          if (iVar11 < 0) {
            pcStack_4c0 = (char *)0x104f56;
            memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
            pcStack_4c0 = (char *)0x104f5e;
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)(mountroot.field_2._M_local_buf + 8));
            pcStack_4c0 = (char *)0x104f71;
            poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
            pcStack_4c0 = (char *)0x104f80;
            poVar19 = std::operator<<(poVar19,
                                      "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                     );
            pcStack_4c0 = (char *)0x104f8f;
            poVar19 = std::operator<<(poVar19,":");
            pcStack_4c0 = (char *)0x104f9c;
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,0xaf);
            pcStack_4c0 = (char *)0x104fab;
            poVar19 = std::operator<<(poVar19,": ");
            pcStack_4c0 = (char *)0x104fba;
            poVar19 = std::operator<<(poVar19,"in_fd >= 0");
            pcStack_4c0 = (char *)0x104fc9;
            poVar19 = std::operator<<(poVar19,": ");
            pcStack_4c0 = (char *)0x104fd1;
            piVar20 = __errno_location();
            pcStack_4c0 = (char *)0x104fd8;
            pcVar23 = strerror(*piVar20);
            pcStack_4c0 = (char *)0x104fe3;
            std::operator<<(poVar19,pcVar23);
            ppcVar26 = &pcStack_4b8;
            goto LAB_001055d2;
          }
          if (iVar11 != 0) {
            pcStack_4c0 = (char *)0x1040ed;
            close(iVar11);
          }
          do {
            pcStack_4c0 = (char *)0x104105;
            __fd = open("/dev/null",1);
            if ((int)__fd < 0) {
              pcStack_4c0 = (char *)0x104569;
              memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
              pcStack_4c0 = (char *)0x104571;
              std::__cxx11::stringstream::stringstream
                        ((stringstream *)(mountroot.field_2._M_local_buf + 8));
              pcStack_4c0 = (char *)0x104584;
              poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
              pcStack_4c0 = (char *)0x104593;
              poVar19 = std::operator<<(poVar19,
                                        "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                       );
              pcStack_4c0 = (char *)0x1045a2;
              poVar19 = std::operator<<(poVar19,":");
              pcStack_4c0 = (char *)0x1045af;
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,0xb7);
              pcStack_4c0 = (char *)0x1045be;
              poVar19 = std::operator<<(poVar19,": ");
              pcStack_4c0 = (char *)0x1045cd;
              poVar19 = std::operator<<(poVar19,"out_fd >= 0");
              pcStack_4c0 = (char *)0x1045dc;
              poVar19 = std::operator<<(poVar19,": ");
              pcStack_4c0 = (char *)0x1045e4;
              piVar20 = __errno_location();
              pcStack_4c0 = (char *)0x1045eb;
              pcVar23 = strerror(*piVar20);
              pcStack_4c0 = (char *)0x1045f6;
              std::operator<<(poVar19,pcVar23);
              ppcVar26 = &pcStack_4b8;
              goto LAB_001055d2;
            }
          } while (__fd < 3);
          pcStack_4c0 = (char *)0x104119;
          close(__fd);
          pcStack_4c0 = (char *)0x10412d;
          std::__cxx11::to_string
                    ((string *)((long)&mountroot.field_2 + 8),mount_directory.field_2._8_8_);
          pcStack_4c0 = (char *)0x104147;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,"-ooffset=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&mountroot.field_2 + 8));
          pcStack_4c0 = (char *)0x104153;
          std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
          if (uVar28 != 0) {
            pcStack_4c0 = (char *)0x104167;
            std::__cxx11::to_string((string *)(st.__glibc_reserved + 2),uVar28);
            pcStack_4c0 = (char *)0x104181;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&mountroot.field_2 + 8),",timeout=",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (st.__glibc_reserved + 2));
            pcStack_4c0 = (char *)0x104194;
            std::__cxx11::string::append((string *)local_c8);
            pcStack_4c0 = (char *)0x1041a0;
            std::__cxx11::string::~string((string *)(mountroot.field_2._M_local_buf + 8));
            pcStack_4c0 = (char *)0x1041ac;
            std::__cxx11::string::~string((string *)(st.__glibc_reserved + 2));
          }
          pcStack_4c0 = (char *)0x1041c6;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f0,"/etc/fuse.conf",
                     (allocator<char> *)(mountroot.field_2._M_local_buf + 8));
          pcStack_4c0 = (char *)0x1041d2;
          bVar5 = tools::xar::fuse_allows_visible_mounts(&local_3f0);
          pcStack_4c0 = (char *)0x1041e1;
          std::__cxx11::string::~string((string *)&local_3f0);
          if (bVar5) {
            pcStack_4c0 = (char *)0x1041f9;
            std::__cxx11::string::append(local_c8);
          }
          pcStack_4c0 = (char *)0x10421b;
          iVar11 = execlp("squashfuse_ll","squashfuse_ll",
                          CONCAT44(local_c8._4_4_,
                                   CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0]))),
                          this_00,CONCAT44(local_68._4_4_,local_68._0_4_),0);
          if (iVar11 != 0) {
            pcStack_4c0 = (char *)0x104ffe;
            memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
            pcStack_4c0 = (char *)0x105006;
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)(mountroot.field_2._M_local_buf + 8));
            pcStack_4c0 = (char *)0x105019;
            poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
            pcStack_4c0 = (char *)0x105028;
            poVar19 = std::operator<<(poVar19,
                                      "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                     );
            pcStack_4c0 = (char *)0x105037;
            poVar19 = std::operator<<(poVar19,":");
            pcStack_4c0 = (char *)0x105044;
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x1cc);
            pcStack_4c0 = (char *)0x105053;
            poVar19 = std::operator<<(poVar19,": ");
            pcStack_4c0 = (char *)0x105062;
            poVar19 = std::operator<<(poVar19,"Failed to exec squashfuse_ll: ");
            pcStack_4c0 = (char *)0x10506a;
            piVar20 = __errno_location();
            pcStack_4c0 = (char *)0x105071;
            pcVar23 = strerror(*piVar20);
            pcStack_4c0 = (char *)0x10507c;
            poVar19 = std::operator<<(poVar19,pcVar23);
            pcStack_4c0 = (char *)0x10508b;
            std::operator<<(poVar19,
                            ". Try installing squashfuse from https://github.com/vasi/squashfuse/releases."
                           );
            ppcVar26 = &pcStack_4b8;
            goto LAB_001055d2;
          }
          pcStack_4c0 = (char *)0x10422f;
          std::__cxx11::string::~string((string *)local_c8);
        }
        else {
          local_c8[0] = (string)0x0;
          local_c8[1] = 0;
          local_c8._2_2_ = 0;
          pcStack_4c0 = (char *)0x104014;
          _Var12 = waitpid(__pid,(int *)local_c8,0);
          if (_Var12 != __pid) {
            pcStack_4c0 = (char *)0x104e0b;
            memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
            pcStack_4c0 = (char *)0x104e13;
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)(mountroot.field_2._M_local_buf + 8));
            pcStack_4c0 = (char *)0x104e26;
            poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
            pcStack_4c0 = (char *)0x104e35;
            poVar19 = std::operator<<(poVar19,
                                      "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                     );
            pcStack_4c0 = (char *)0x104e44;
            poVar19 = std::operator<<(poVar19,":");
            pcStack_4c0 = (char *)0x104e51;
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x1d2);
            pcStack_4c0 = (char *)0x104e60;
            poVar19 = std::operator<<(poVar19,": ");
            pcStack_4c0 = (char *)0x104e6f;
            poVar19 = std::operator<<(poVar19,"waitpid(pid, &status, 0) == pid");
            pcStack_4c0 = (char *)0x104e7e;
            poVar19 = std::operator<<(poVar19,": ");
            pcStack_4c0 = (char *)0x104e86;
            piVar20 = __errno_location();
            pcStack_4c0 = (char *)0x104e8d;
            pcVar23 = strerror(*piVar20);
            pcStack_4c0 = (char *)0x104e98;
            std::operator<<(poVar19,pcVar23);
            ppcVar26 = &pcStack_4b8;
            goto LAB_001055d2;
          }
          if (((byte)local_c8[0] & 0x7f) != 0) {
            this = (stringstream *)(mountroot.field_2._M_local_buf + 8);
            if ((int)((CONCAT11(local_c8[1],local_c8[0]) & 0x7f) * 0x1000000 + 0x1000000) <
                0x2000000) {
              pcStack_4c0 = (char *)0x10514c;
              memset(this,0,0x188);
              pcStack_4c0 = (char *)0x105154;
              std::__cxx11::stringstream::stringstream(this);
              pcStack_4c0 = (char *)0x105167;
              poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
              pcStack_4c0 = (char *)0x105176;
              poVar19 = std::operator<<(poVar19,
                                        "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                       );
              pcStack_4c0 = (char *)0x105185;
              poVar19 = std::operator<<(poVar19,":");
              pcStack_4c0 = (char *)0x105192;
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x1dc);
              pcStack_4c0 = (char *)0x1051a1;
              poVar19 = std::operator<<(poVar19,": ");
              pcStack_4c0 = (char *)0x1051b0;
              poVar19 = std::operator<<(poVar19,"squashfuse_ll failed with unknown exit status ");
              pcStack_4c0 = (char *)0x1051be;
              std::ostream::operator<<
                        (poVar19,CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
              ppcVar26 = &pcStack_4b8;
            }
            else {
              pcStack_4c0 = (char *)0x104ec6;
              memset(this,0,0x188);
              pcStack_4c0 = (char *)0x104ece;
              std::__cxx11::stringstream::stringstream(this);
              pcStack_4c0 = (char *)0x104ee1;
              poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
              pcStack_4c0 = (char *)0x104ef0;
              poVar19 = std::operator<<(poVar19,
                                        "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                       );
              pcStack_4c0 = (char *)0x104eff;
              poVar19 = std::operator<<(poVar19,":");
              pcStack_4c0 = (char *)0x104f0c;
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x1da);
              pcStack_4c0 = (char *)0x104f1b;
              poVar19 = std::operator<<(poVar19,": ");
              pcStack_4c0 = (char *)0x104f2a;
              poVar19 = std::operator<<(poVar19,"squashfuse_ll failed with signal ");
              pcStack_4c0 = (char *)0x104f3b;
              std::ostream::operator<<(poVar19,CONCAT11(local_c8[1],local_c8[0]) & 0x7f);
              ppcVar26 = &pcStack_4b8;
            }
            goto LAB_001055d2;
          }
          if (local_c8[1] != 0) {
            pcStack_4c0 = (char *)0x10404f;
            memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
            pcStack_4c0 = (char *)0x104057;
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)(mountroot.field_2._M_local_buf + 8));
            pcStack_4c0 = (char *)0x10406a;
            poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
            pcStack_4c0 = (char *)0x104079;
            poVar19 = std::operator<<(poVar19,
                                      "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                     );
            pcStack_4c0 = (char *)0x104088;
            poVar19 = std::operator<<(poVar19,":");
            pcStack_4c0 = (char *)0x104095;
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x1d6);
            pcStack_4c0 = (char *)0x1040a4;
            poVar19 = std::operator<<(poVar19,": ");
            pcStack_4c0 = (char *)0x1040b3;
            poVar19 = std::operator<<(poVar19,"squashfuse_ll failed with exit status ");
            pcStack_4c0 = (char *)0x1040c2;
            std::ostream::operator<<(poVar19,(uint)local_c8[1]);
            ppcVar26 = &pcStack_4b8;
            goto LAB_001055d2;
          }
        }
      }
      mount_directory.field_2._8_8_ = (ulong)(iVar13 - 2) - mount_path.field_2._8_8_;
      pcStack_4c0 = (char *)0x104240;
      lVar21 = std::chrono::_V2::steady_clock::now();
      while( true ) {
        pcStack_4c0 = (char *)0x104258;
        bVar5 = anon_unknown.dwarf_5eda::is_squashfuse_mounted((string *)local_68,false);
        if (bVar5) break;
        pcStack_4c0 = (char *)0x104261;
        lVar22 = std::chrono::_V2::steady_clock::now();
        if (9000000000 < lVar22 - lVar21) {
          pcStack_4c0 = (char *)0x10446b;
          memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
          pcStack_4c0 = (char *)0x104473;
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)(mountroot.field_2._M_local_buf + 8));
          pcStack_4c0 = (char *)0x104486;
          poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
          pcStack_4c0 = (char *)0x104495;
          poVar19 = std::operator<<(poVar19,
                                    "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                   );
          pcStack_4c0 = (char *)0x1044a4;
          poVar19 = std::operator<<(poVar19,":");
          pcStack_4c0 = (char *)0x1044b1;
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x1e7);
          pcStack_4c0 = (char *)0x1044c0;
          poVar19 = std::operator<<(poVar19,": ");
          pcStack_4c0 = (char *)0x1044cf;
          std::operator<<(poVar19,"timed out waiting for squashfs mount");
          ppcVar26 = &pcStack_4b8;
          goto LAB_001055d2;
        }
        mountroot.field_2._8_8_ = 100;
        pcStack_4c0 = (char *)0x10428a;
        std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>
                  ((duration<long,_std::ratio<1L,_1000000L>_> *)((long)&mountroot.field_2 + 8));
      }
      pcStack_4c0 = (char *)0x104296;
      iVar10 = futimes(iVar10,(timeval *)0x0);
      if (iVar10 == 0) {
        if (pcVar23 == (char *)0x0) {
          if (local_38 == -1) {
            pcStack_4c0 = (char *)0x1042db;
            iVar10 = open((char *)user_basedir.field_2._8_8_,0);
            if (iVar10 == -1) {
              pcStack_4c0 = (char *)0x1050a6;
              memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
              pcStack_4c0 = (char *)0x1050ae;
              std::__cxx11::stringstream::stringstream
                        ((stringstream *)(mountroot.field_2._M_local_buf + 8));
              pcStack_4c0 = (char *)0x1050c1;
              poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
              pcStack_4c0 = (char *)0x1050d0;
              poVar19 = std::operator<<(poVar19,
                                        "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                       );
              pcStack_4c0 = (char *)0x1050df;
              poVar19 = std::operator<<(poVar19,":");
              pcStack_4c0 = (char *)0x1050ec;
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x1fc);
              pcStack_4c0 = (char *)0x1050fb;
              poVar19 = std::operator<<(poVar19,": ");
              pcStack_4c0 = (char *)0x10510a;
              poVar19 = std::operator<<(poVar19,"Unable to open ");
              pcStack_4c0 = (char *)0x105119;
              poVar19 = std::operator<<(poVar19,(string *)(user_basedir.field_2._M_local_buf + 8));
              pcStack_4c0 = (char *)0x105128;
              poVar19 = std::operator<<(poVar19,": ");
              pcStack_4c0 = (char *)0x105130;
              piVar20 = __errno_location();
              pcStack_4c0 = (char *)0x105137;
              pcVar23 = strerror(*piVar20);
              pcStack_4c0 = (char *)0x105142;
              std::operator<<(poVar19,pcVar23);
              ppcVar26 = &pcStack_4b8;
              goto LAB_001055d2;
            }
          }
          uVar28 = (ulong)((iVar13 - mount_path.field_2._8_4_) + 3) * 8 + 0xf & 0xfffffffffffffff0;
          lVar21 = -uVar28;
          ppcVar26 = (char **)(local_4b0 + lVar21 + -8);
          mount_path.field_2._8_8_ = &pcStack_4b8;
          *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104315;
          pcVar23 = strdup("/bin/sh");
          *ppcVar26 = pcVar23;
          *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104328;
          pcVar17 = strdup("-e");
          *(char **)(local_4b0 + lVar21) = pcVar17;
          *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x10433b;
          pcVar24 = strdup((char *)user_basedir.field_2._8_8_);
          *(char **)((mount_path.field_2._8_8_ + 0x10) - uVar28) = pcVar24;
          if (((pcVar23 == (char *)0x0) || (pcVar17 == (char *)0x0)) || (pcVar24 == (char *)0x0)) {
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104af7;
            memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104aff;
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)(mountroot.field_2._M_local_buf + 8));
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104b12;
            poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104b21;
            poVar19 = std::operator<<(poVar19,
                                      "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                     );
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104b30;
            poVar19 = std::operator<<(poVar19,":");
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104b3d;
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x20c);
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104b4c;
            poVar19 = std::operator<<(poVar19,": ");
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104b5b;
            poVar19 = std::operator<<(poVar19,"strdup failed, call the cops");
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104b6a;
            poVar19 = std::operator<<(poVar19,": ");
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104b72;
            piVar20 = __errno_location();
            iVar13 = *piVar20;
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104b79;
            pcVar23 = strerror(iVar13);
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104b84;
            std::operator<<(poVar19,pcVar23);
            goto LAB_001055d2;
          }
          *(xar **)((long)&st + lVar21 + -8) = this_00;
          lVar22 = (long)(int)mount_directory.field_2._8_4_;
          for (lVar25 = 0; lVar25 < lVar22; lVar25 = lVar25 + 1) {
            *(char **)((long)&st + lVar25 * 8 + lVar21) = ppcVar27[lVar25];
          }
          ppcVar26[lVar29] = (char *)0x0;
          if (!bVar7) {
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 1;
            uVar2 = *(undefined8 *)((long)&pcStack_4c0 + lVar21);
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x1043af;
            setenv("XARFUSE_NEW_MOUNT","1",(int)uVar2);
          }
          *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x1043b7;
          umask(__mask);
          pcVar23 = *ppcVar26;
          *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x1043c2;
          iVar13 = execv(pcVar23,ppcVar26);
          if (iVar13 != 0) {
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104d58;
            memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104d60;
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)(mountroot.field_2._M_local_buf + 8));
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104d73;
            poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104d82;
            poVar19 = std::operator<<(poVar19,
                                      "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                                     );
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104d91;
            poVar19 = std::operator<<(poVar19,":");
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104d9e;
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x21f);
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104dad;
            poVar19 = std::operator<<(poVar19,": ");
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104dbc;
            poVar19 = std::operator<<(poVar19,"execv: ");
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104dc4;
            piVar20 = __errno_location();
            iVar13 = *piVar20;
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104dcb;
            pcVar23 = strerror(iVar13);
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104dd6;
            poVar19 = std::operator<<(poVar19,pcVar23);
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104de5;
            poVar19 = std::operator<<(poVar19,"cmd: ");
            pcVar23 = *ppcVar26;
            *(undefined8 *)((long)&pcStack_4c0 + lVar21) = 0x104df0;
            std::operator<<(poVar19,pcVar23);
            goto LAB_001055d2;
          }
        }
        else {
          pcStack_4c0 = (char *)0x1042b8;
          poVar19 = std::operator<<((ostream *)&std::cout,(string *)local_68);
          pcStack_4c0 = (char *)0x1042c0;
          std::endl<char,std::char_traits<char>>(poVar19);
        }
        pcStack_4c0 = (char *)0x1043da;
        std::__cxx11::string::~string((string *)(user_basedir.field_2._M_local_buf + 8));
        pcStack_4c0 = (char *)0x1043e6;
        std::__cxx11::string::~string((string *)local_3d0);
        goto LAB_001043e6;
      }
      pcStack_4c0 = (char *)0x104a4f;
      memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
      pcStack_4c0 = (char *)0x104a57;
      std::__cxx11::stringstream::stringstream((stringstream *)(mountroot.field_2._M_local_buf + 8))
      ;
      pcStack_4c0 = (char *)0x104a6a;
      poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
      pcStack_4c0 = (char *)0x104a79;
      poVar19 = std::operator<<(poVar19,
                                "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                               );
      pcStack_4c0 = (char *)0x104a88;
      poVar19 = std::operator<<(poVar19,":");
      pcStack_4c0 = (char *)0x104a95;
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x1ef);
      pcStack_4c0 = (char *)0x104aa4;
      poVar19 = std::operator<<(poVar19,": ");
      pcStack_4c0 = (char *)0x104ab3;
      poVar19 = std::operator<<(poVar19,"futimes(lock_fd, nullptr) == 0");
      pcStack_4c0 = (char *)0x104ac2;
      poVar19 = std::operator<<(poVar19,": ");
      pcStack_4c0 = (char *)0x104aca;
      piVar20 = __errno_location();
      pcStack_4c0 = (char *)0x104ad1;
      pcVar23 = strerror(*piVar20);
      pcStack_4c0 = (char *)0x104adc;
      std::operator<<(poVar19,pcVar23);
      ppcVar26 = &pcStack_4b8;
    }
    else {
      pcStack_4c0 = (char *)0x1049b6;
      memset((stringstream *)(mountroot.field_2._M_local_buf + 8),0,0x188);
      pcStack_4c0 = (char *)0x1049be;
      std::__cxx11::stringstream::stringstream((stringstream *)(mountroot.field_2._M_local_buf + 8))
      ;
      pcStack_4c0 = (char *)0x1049d1;
      poVar19 = std::operator<<((ostream *)&st_1.st_ino,"FATAL ");
      pcStack_4c0 = (char *)0x1049e0;
      poVar19 = std::operator<<(poVar19,
                                "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                               );
      pcStack_4c0 = (char *)0x1049ef;
      poVar19 = std::operator<<(poVar19,":");
      pcStack_4c0 = (char *)0x1049fc;
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x85);
      pcStack_4c0 = (char *)0x104a0b;
      poVar19 = std::operator<<(poVar19,": ");
      pcStack_4c0 = (char *)0x104a1a;
      poVar19 = std::operator<<(poVar19,"can\'t flock lockfile: ");
      pcStack_4c0 = (char *)0x104a22;
      piVar20 = __errno_location();
      pcStack_4c0 = (char *)0x104a29;
      pcVar23 = strerror(*piVar20);
      pcStack_4c0 = (char *)0x104a34;
      std::operator<<(poVar19,pcVar23);
      ppcVar26 = &pcStack_4b8;
    }
  }
LAB_001055d2:
  ppcVar26[-1] = &LAB_001055de;
  tools::xar::detail::LogFatal::~LogFatal((LogFatal *)((long)&mountroot.field_2 + 8));
}

Assistant:

int main(int argc, char** argv) {
  struct timeval tv;
  gettimeofday(&tv, nullptr);
  double launch_time = (double)tv.tv_usec / 1000000.0 + tv.tv_sec;
  setenv("XAREXEC_LAUNCH_TIMESTAMP", std::to_string(launch_time).c_str(), true);
  XAR_CHECK_SIMPLE(getuid() == geteuid());
  // Set our umask to a good default for the files we create.  Save
  // the old value to restore before executing the XAR bootstrap
  // script.
  auto old_umask = umask(0022);

  if (argc < 2) {
    usage();
    return 1;
  }

  // Skip past our executable name, the optional -m flag, and, after
  // stashing a copy of it, the path to the xar file.  This leaves
  // argv[0:argc-1] as the parameters to pass to the process we exec.
  argv++;
  argc--;
  bool mount_only = false;
  bool print_only = false;
  while (argv[0] && argv[0][0] == '-') {
    if (strcmp(argv[0], "-m") == 0) {
      mount_only = true;
    } else if (strcmp(argv[0], "-n") == 0) {
      print_only = true;
    } else if (strcmp(argv[0], "-h") == 0) {
      usage();
      return 0;
    } else {
      usage();
      return 1;
    }
    argv++;
    argc--;
  }
  if (!argv[0]) {
    usage();
    return 1;
  }
  char* xar_path = argv[0];
  argv++;
  argc--;

  // Extract our required fields from the XAR header.  XAREXEC_TARGET
  // is required unless the -m flag was used.
  auto header = tools::xar::read_xar_header(xar_path);
  size_t offset;
  try {
    size_t end;
    offset = std::stoull(header[tools::xar::kOffsetName], &end);
    if (end != header[tools::xar::kOffsetName].size()) {
      throw std::invalid_argument("Offset not entirely an integer");
    }
  } catch (const std::exception& ex) {
    cerr << "Header offset is non-integral: " << header[tools::xar::kOffsetName]
         << endl;
    XAR_FATAL << "Exact error: " << ex.what();
  }
  std::string uuid = header[tools::xar::kUuidName];
  std::string execpath;
  auto it = header.find(tools::xar::kXarexecTarget);
  if (it != header.end()) {
    execpath = it->second;
  }
  if (!mount_only && execpath.empty()) {
    XAR_FATAL << "No XAREXEC_TARGET in XAR header of " << xar_path;
  }
  if (!std::all_of(uuid.begin(), uuid.end(), isxdigit)) {
    XAR_FATAL << "uuid must only contain hex digits";
  }
  if (uuid.empty()) {
    XAR_FATAL << "uuid must be non-empty";
  }

  // If provided, use a non-default mount root from the header.
  std::string mountroot;
  it = header.find(tools::xar::kMountRoot);
  if (it != header.end()) {
    mountroot = it->second;
  } else {
    // Otherwise find the first proper mount root from our list of
    // defaults.
    for (const auto& candidate : tools::xar::default_mount_roots()) {
      struct stat st;
      if (stat(candidate.c_str(), &st) == 0 && (st.st_mode & 07777) == 01777) {
        mountroot = candidate;
        break;
      }
    }
    if (mountroot.empty()) {
      tools::xar::no_mount_roots_help_message(XAR_FATAL);
    }
  }

  struct stat st;
  if (stat(mountroot.c_str(), &st) != 0) {
    XAR_FATAL << "Failed to stat mount root '" << mountroot
              << "': " << strerror(errno);
  }
  if ((st.st_mode & 07777) != 01777) {
    XAR_FATAL << "Mount root '" << mountroot << "' permissions should be 01777";
  }

  // Path is /mnt/xarfuse/uid-N/UUID-ns-Y; we make directories under
  // /mnt/xarfuse as needed. Replace /mnt/xarfuse with custom values
  // as specified.
  std::string user_basedir = get_user_basedir(mountroot);

  // mtab sucks.  In some environments, particularly centos6, when
  // mtab is shared between different mount namespaces, we want to
  // disambiguate by more than just the XAR's uuid and user's uid.  We
  // use the mount namespace id, but optionally also take a
  // user-specified "seed" from the environment.  We cannot rely
  // purely on mount namespace as the kernel will aggressively re-use
  // namespace IDs, so while namespace helps with concurrent jobs, it
  // can fail with jobs run after other jobs.
  auto env_seed = getenv("XAR_MOUNT_SEED");
  std::string mount_directory = uuid;
  if (env_seed && *env_seed && strchr(env_seed, '/') == nullptr) {
    mount_directory += "-seed-";
    mount_directory += env_seed;
  } else if (stat("/proc/self/ns/pid", &st) == 0) {
    mount_directory += "-seed-nspid" + std::to_string(st.st_ino);

    // Sometimes we are in the same namespace but different cgroups
    // (e.g. systemd using cgroups to control process lifetime but not
    // putting processes into mount namespaces).  This can cause
    // cgroup termination to destroy a shared squashfuse_ll process.
    //
    // Use the inode of the cgroup we are running in.  Note this is
    // best effort in kernel 5.2 as inode numbers can be reused
    // sequentially (but not concurrently); kernel 5.6 makes this
    // truly unique across boots.
    auto maybe_cgroup_inode =
        tools::xar::read_sysfs_cgroup_inode("/proc/self/cgroup");
    if (maybe_cgroup_inode) {
      mount_directory += "_cgpid" + std::to_string(*maybe_cgroup_inode);
    }
  }

  // Try to determine our mount namespace id (via the inode on
  // /proc/self/ns/mnt); if we can, make that part of our mountpoint's
  // name.  This ensures that /etc/mtab on centos6 has unique entries
  // for processes in different namespaces, even if /etc itself is
  // shared among them.  See t12007704 for details.
  // Note: will fail on macOS.
  if (stat("/proc/self/ns/mnt", &st) == 0) {
    mount_directory += "-ns-" + std::to_string(st.st_ino);
  }

  const size_t squashfuse_idle_timeout = get_squashfuse_timeout();

  auto mount_path = user_basedir + "/" + mount_directory;
  if (print_only) {
    cout << mount_path << endl;
    return 0;
  }

  // Our lockfile for directory /mnt/xarfuse/uid-N/UUID-ns-Y is
  // /mnt/xarfuse/uid-N/lockfile.UUID-ns-Y.
  auto lockfile = user_basedir + "/lockfile." + mount_directory;
  int lock_fd = grab_lock(lockfile);
  if (mkdir(mount_path.c_str(), 0755) == 0) {
    // On macOS, mkdir sets the new directory's group to the enclosing directory
    // which is not necessarily owned by the euid executing the xar. Instead,
    // chown() the new directory to the euid and egid.
    if (kIsDarwin) {
      XAR_PCHECK_SIMPLE(chown(mount_path.c_str(), geteuid(), getegid()) == 0);
    }
  } else if (errno != EEXIST) {
    XAR_FATAL << "mkdir failed:" << strerror(errno);
  }

  // Construct our exec path; if it already exists, we're done and can
  // simply execute it.
  const std::string exec_path = mount_path + "/" + execpath;
  if (tools::xar::debugging) {
    cerr << "exec: " << exec_path << " as " << getuid() << " " << getgid()
         << endl;
  }

  // Hold a file descriptor open to one of the files in the XAR; this
  // will prevent unmounting as we exec the bootstrap and it execs
  // anything.  Intentionally not O_CLOEXEC.  This is necessary
  // because the exec call typically targets a shell script inside the
  // XAR and so the script won't remain open while the exec happens --
  // the kernel will examine it, run a bash process, and that will
  // open the shell script.  Between the parsing and bash opening it,
  // the mount point could disappear.  Also, that script itself often
  // exec's the python interpreter living on local disk, which will
  // open a py file in the XAR... again a brief moment where the
  // unmount can occur.  We open now, very early to signal to
  // squashfuse_ll before the statfs call, but will try to re-open
  // later if this one fails.  So ignore the return code for now.
  int bootstrap_fd = open(exec_path.c_str(), O_RDONLY);

  bool newMount = false;
  // TODO(chip): also mount DEPENDENCIES
  if (!is_squashfuse_mounted(mount_path, true)) {
    // This should never happen.  And yet, just in case, let's make
    // sure we will hold the right file open.
    if (bootstrap_fd != -1) {
      // TODO: one day we should find a way to log or bump a key; this
      // would be a good case.
      close(bootstrap_fd);
      bootstrap_fd = -1;
    }
    // Check mount_path sanity before mounting; once mounted, though,
    // the permissions may change, so we have to do the check after we
    // grab the lock but know we need to perform a mount.
    check_file_sanity(mount_path, Expectation::Directory, 0755);

    pid_t pid = fork();
    XAR_PCHECK_SIMPLE(pid >= 0);
    if (pid == 0) {
      sanitize_file_descriptors();
      std::string opts = "-ooffset=" + std::to_string(offset);
      if (squashfuse_idle_timeout > 0) {
        opts += ",timeout=" + std::to_string(squashfuse_idle_timeout);
      }
      if (tools::xar::fuse_allows_visible_mounts("/etc/fuse.conf")) {
        opts += ",allow_root";
      }
      auto const ret = execlp(
          kSquashFuseExecutable,
          kSquashFuseExecutable,
          opts.c_str(),
          xar_path,
          mount_path.c_str(),
          nullptr);
      if (ret != 0) {
        XAR_FATAL << "Failed to exec squashfuse_ll: " << strerror(errno)
                  << ". Try installing squashfuse from "
                     "https://github.com/vasi/squashfuse/releases.";
      }
    } else {
      int status = 0;
      XAR_PCHECK_SIMPLE(waitpid(pid, &status, 0) == pid);
      // We only make it out of this block if we have an exit status of 0.
      if (WIFEXITED(status)) {
        if (WEXITSTATUS(status) != 0) {
          XAR_FATAL << "squashfuse_ll failed with exit status "
                    << WEXITSTATUS(status);
        }
      } else if (WIFSIGNALED(status)) {
        XAR_FATAL << "squashfuse_ll failed with signal " << WTERMSIG(status);
      } else {
        XAR_FATAL << "squashfuse_ll failed with unknown exit status " << status;
      }
    }
    newMount = true;
  }

  // Wait for up to 9 seconds for mount to be available
  auto start = std::chrono::steady_clock::now();
  auto timeout = std::chrono::seconds(9);
  while (!is_squashfuse_mounted(mount_path, false)) {
    if (std::chrono::steady_clock::now() - start > timeout) {
      XAR_FATAL << "timed out waiting for squashfs mount";
    }
    /* sleep override */
    std::this_thread::sleep_for(std::chrono::microseconds(100));
  }

  // Touch the lockfile; our unmount script will use it as a proxy for
  // unmounting "stale" mounts.
  XAR_PCHECK_SIMPLE(futimes(lock_fd, nullptr) == 0);

  if (mount_only) {
    cout << mount_path << endl;
    return 0;
  }

  // Retry opening our fd if we failed before.
  if (bootstrap_fd == -1) {
    bootstrap_fd = open(exec_path.c_str(), O_RDONLY);
  }
  // Still no success?  Bail.
  if (bootstrap_fd == -1) {
    XAR_FATAL << "Unable to open " << exec_path << ": " << strerror(errno);
  }

  // cmd line is:
  // newArgs[0] = "/bin/sh"
  // newArgs[1] = "-e"
  // newArgs[2] = mounted path inside squash file to run
  // newArgs[3] = path to the squash file itself
  // newArgs[4], newArgs[5], ... = args passed on our command line

  // Why argc + 5?  The 4 new params and the trailing nullptr entry.
  char* newArgs[argc + 5];
  newArgs[0] = strdup("/bin/sh");
  newArgs[1] = strdup("-e");
  newArgs[2] = strdup(exec_path.c_str());
  if (!newArgs[0] || !newArgs[1] || !newArgs[2]) {
    XAR_FATAL << "strdup failed, call the cops"
              << ": " << strerror(errno);
  }
  newArgs[3] = xar_path;
  for (int i = 0; i < argc; ++i) {
    newArgs[i + 4] = argv[i];
  }
  newArgs[argc + 4] = nullptr;
  for (int i = 0; newArgs[i]; ++i) {
    if (tools::xar::debugging) {
      cerr << "  exec arg: " << newArgs[i] << endl;
    }
  }

  if (newMount) {
    setenv("XARFUSE_NEW_MOUNT", "1", 1);
  }
  umask(old_umask);
  if (execv(newArgs[0], newArgs) != 0) {
    XAR_FATAL << "execv: " << strerror(errno) << "cmd: " << newArgs[0];
  }

  return 0;
}